

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::Log<float&,float&,float&,float&>
               (LogLevel level,char *file,int line,char *fmt,float *args,float *args_1,float *args_2
               ,float *args_3)

{
  char *in_stack_00000018;
  int in_stack_00000024;
  string s;
  float *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  StringPrintf<float&,float&,float&,float&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::c_str();
  Log(s._M_string_length._4_4_,(char *)s._0_8_,in_stack_00000024,in_stack_00000018);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

inline void Log(LogLevel level, const char *file, int line, const char *fmt,
                Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    Log(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    Log(level, file, line, s.c_str());
#endif
}